

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestForeignDiscard(void)

{
  bool bVar1;
  OutputBuffer buf;
  string world;
  string there;
  string again;
  string hello;
  lazy_ostream *in_stack_fffffffffffffb18;
  basic_cstring<const_char> *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  OutputBuffer *in_stack_fffffffffffffb38;
  InputBuffer *in_stack_fffffffffffffb40;
  size_t in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  const_string *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb68;
  const_string *file;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  begin *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_fffffffffffffb98;
  undefined1 local_3bc [28];
  undefined1 local_3a0 [56];
  basic_cstring<const_char> local_368 [2];
  undefined4 local_344;
  InputBuffer *in_stack_fffffffffffffcc0;
  const_string *buf_00;
  basic_cstring<const_char> local_338;
  undefined1 local_328 [56];
  basic_cstring<const_char> local_2f0 [2];
  undefined1 local_2cc [28];
  undefined1 local_2b0 [56];
  basic_cstring<const_char> local_278 [2];
  undefined1 local_254 [28];
  undefined1 local_238 [56];
  basic_cstring<const_char> local_200 [2];
  string local_1e0 [104];
  string local_178 [127];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            ((begin *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             (const_string *)in_stack_fffffffffffffb28,(size_t)in_stack_fffffffffffffb20);
  boost::unit_test::unit_test_log_t::operator<<
            ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffb28,
             (log_level)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffb28,(char (*) [12])in_stack_fffffffffffffb20);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> *)
             0x23d9d4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffb20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  std::allocator<char>::~allocator(&local_f9);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffb20,(data_type *)in_stack_fffffffffffffb18,
             0x23db36);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::__cxx11::string::string(local_178,local_a8);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            (in_stack_fffffffffffffb98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void_()> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68,(type_conflict3)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  avro::OutputBuffer::appendForeignData
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(size_type)in_stack_fffffffffffffb20,
             (free_func *)in_stack_fffffffffffffb18);
  boost::function<void_()>::~function((function<void_()> *)0x23dbec);
  boost::_bi::
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~bind_t((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x23dbf9);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::__cxx11::string::string(local_1e0,local_d0);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            (in_stack_fffffffffffffb98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void_()> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68,(type_conflict3)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  avro::OutputBuffer::appendForeignData
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(size_type)in_stack_fffffffffffffb20,
             (free_func *)in_stack_fffffffffffffb18);
  boost::function<void_()>::~function((function<void_()> *)0x23dcba);
  boost::_bi::
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~bind_t((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x23dcc7);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffb20,(data_type *)in_stack_fffffffffffffb18,
             0x23dd16);
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  printBuffer(in_stack_fffffffffffffcc0);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23dd4b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffb20);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (const_string *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
               in_stack_fffffffffffffb58);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb28,(char (*) [1])in_stack_fffffffffffffb20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_254 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_254._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x23ddfd);
    local_254._0_4_ = 0x18;
    in_stack_fffffffffffffb28 = "24U";
    in_stack_fffffffffffffb20 = (basic_cstring<const_char> *)local_254;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_238,local_254 + 0xc,0x43a,1,2,local_254 + 4,"buf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23de82);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::discardData
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48);
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  printBuffer(in_stack_fffffffffffffcc0);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23dee2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffb20);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (const_string *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
               in_stack_fffffffffffffb58);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb28,(char (*) [1])in_stack_fffffffffffffb20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2cc + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2cc._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x23df88);
    local_2cc._0_4_ = 0xf;
    in_stack_fffffffffffffb28 = "15U";
    in_stack_fffffffffffffb20 = (basic_cstring<const_char> *)local_2cc;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_2b0,local_2cc + 0xc,0x43f,1,2,local_2cc + 4,"buf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23e007);
    in_stack_fffffffffffffb77 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb77);
  safeToDelete = true;
  avro::OutputBuffer::discardData
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  printBuffer(in_stack_fffffffffffffcc0);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23e07b);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_2f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffb20);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),file
               ,(size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    in_stack_fffffffffffffb60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb28,(char (*) [1])in_stack_fffffffffffffb20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_fffffffffffffb58 = (const_string *)avro::OutputBuffer::size((OutputBuffer *)0x23e121);
    local_344 = 9;
    in_stack_fffffffffffffb28 = "9U";
    in_stack_fffffffffffffb20 = (basic_cstring<const_char> *)&local_344;
    buf_00 = in_stack_fffffffffffffb58;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_328,&local_338,0x446,1,2,&stack0xfffffffffffffcc0,"buf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23e1a0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  safeToDelete = true;
  avro::OutputBuffer::discardData
            ((OutputBuffer *)CONCAT17(bVar1,in_stack_fffffffffffffb50),in_stack_fffffffffffffb48);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  printBuffer((InputBuffer *)buf_00);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23e214);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffb20);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),file
               ,(size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb28,(char (*) [1])in_stack_fffffffffffffb20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3bc + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_3bc._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x23e2ba);
    local_3bc._0_4_ = 6;
    in_stack_fffffffffffffb28 = "6U";
    in_stack_fffffffffffffb20 = (basic_cstring<const_char> *)local_3bc;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3a0,local_3bc + 0xc,0x44d,1,2,local_3bc + 4,"buf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23e339);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23e35f);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestForeignDiscard ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string again = "again ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer buf;
        buf.writeTo(hello.c_str(), hello.size());
        buf.appendForeignData(again.c_str(), again.size(), boost::bind(&deleteForeign, again));
        buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
        buf.writeTo(world.c_str(), world.size());
        
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 24U);

        // discard some data including half the foreign buffer
        buf.discardData(9);
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 15U);
        
        // discard some more data, which will lop off the first foreign buffer
        safeToDelete = true;
        buf.discardData(6);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 9U);

        // discard some more data, which will lop off the second foreign buffer
        safeToDelete = true;
        buf.discardData(3);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 6U);
    }
}